

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

FmsInt CompareScalarData(FmsScalarType stype,FmsInt size,void *lhs,void *rhs)

{
  long lVar1;
  FmsInt FVar2;
  FmsInt FVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  
  if (lhs == rhs) {
    return 0;
  }
  FVar2 = 1;
  if (rhs != (void *)0x0 && lhs != (void *)0x0) {
    switch(stype) {
    case FMS_FLOAT:
      if (size == 0) {
        return 0;
      }
      FVar2 = 0;
      FVar3 = 1;
      do {
        fVar7 = *(float *)((long)lhs + FVar3 * 4 + -4) - *(float *)((long)rhs + FVar3 * 4 + -4);
        if (fVar7 < 0.0) {
          fVar7 = -fVar7;
        }
        if (1e-06 < fVar7) {
          return FVar3;
        }
        bVar4 = FVar3 != size;
        FVar3 = FVar3 + 1;
      } while (bVar4);
      break;
    case FMS_DOUBLE:
      if (size == 0) {
        return 0;
      }
      FVar2 = 0;
      FVar3 = 1;
      do {
        dVar5 = *(double *)((long)lhs + FVar3 * 8 + -8) - *(double *)((long)rhs + FVar3 * 8 + -8);
        dVar6 = -dVar5;
        if (-dVar5 <= dVar5) {
          dVar6 = dVar5;
        }
        if (1e-06 < dVar6) {
          return FVar3;
        }
        bVar4 = FVar3 != size;
        FVar3 = FVar3 + 1;
      } while (bVar4);
      break;
    case FMS_COMPLEX_FLOAT:
      if ((size & 0x7fffffffffffffff) == 0) {
        return 0;
      }
      FVar3 = 1;
      FVar2 = 0;
      do {
        fVar7 = *(float *)((long)lhs + FVar3 * 4 + -4) - *(float *)((long)rhs + FVar3 * 4 + -4);
        if (fVar7 < 0.0) {
          fVar7 = -fVar7;
        }
        if (1e-06 < fVar7) {
          return FVar3;
        }
        lVar1 = size * -2 + FVar3;
        FVar3 = FVar3 + 1;
      } while (lVar1 != 0);
      break;
    case FMS_COMPLEX_DOUBLE:
      if ((size & 0x7fffffffffffffff) == 0) {
        return 0;
      }
      FVar3 = 1;
      FVar2 = 0;
      do {
        dVar5 = *(double *)((long)lhs + FVar3 * 8 + -8) - *(double *)((long)rhs + FVar3 * 8 + -8);
        dVar6 = -dVar5;
        if (-dVar5 <= dVar5) {
          dVar6 = dVar5;
        }
        if (1e-06 < dVar6) {
          return FVar3;
        }
        lVar1 = size * -2 + FVar3;
        FVar3 = FVar3 + 1;
      } while (lVar1 != 0);
      break;
    default:
      return 2;
    }
  }
  return FVar2;
}

Assistant:

static inline FmsInt CompareScalarData(FmsScalarType stype, FmsInt size,
                                       const void *lhs, const void *rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return 1;
  if(!rhs) return 1;
  FmsInt isDifferent = 0;
  switch(stype) {
  case FMS_FLOAT:
    COMPARE_SCALAR_DATA(float, lhs, rhs, size, isDifferent);
    break;
  case FMS_DOUBLE:
    COMPARE_SCALAR_DATA(double, lhs, rhs, size, isDifferent);
    break;
  case FMS_COMPLEX_FLOAT:
    COMPARE_SCALAR_DATA(float, lhs, rhs, size*2, isDifferent);
    break;
  case FMS_COMPLEX_DOUBLE:
    COMPARE_SCALAR_DATA(double, lhs, rhs, size*2, isDifferent);
    break;
  default:
    return 2;
  }
  return isDifferent;
}